

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls12_client.c
# Opt level: O0

int ssl_parse_server_hello(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_handshake_params *pmVar1;
  ulong uVar2;
  uchar *puVar3;
  bool bVar4;
  uint16_t uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  size_t sVar9;
  ulong uVar10;
  size_t sVar11;
  mbedtls_ssl_ciphersuite_t *pmVar12;
  long lVar13;
  char *pcVar14;
  undefined4 uVar15;
  uint ext_size;
  uint ext_id;
  mbedtls_ssl_ciphersuite_t *suite_info;
  int handshake_failure;
  uchar comp;
  uchar *ext;
  uchar *buf;
  size_t ext_len;
  size_t n;
  int i;
  int ret;
  mbedtls_ssl_context *ssl_local;
  
  bVar4 = false;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
             ,0x4a9,"=> parse server hello");
  ssl_local._4_4_ = mbedtls_ssl_read_record(ssl,1);
  if (ssl_local._4_4_ == 0) {
    _handshake_failure = ssl->in_msg;
    if (ssl->in_msgtype == 0x16) {
      if (ssl->conf->transport == '\x01') {
        if (*_handshake_failure == '\x03') {
          mbedtls_debug_print_msg
                    (ssl,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                     ,0x4d2,"received hello verify request");
          mbedtls_debug_print_msg
                    (ssl,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                     ,0x4d3,"<= parse server hello");
          iVar6 = ssl_parse_hello_verify_request(ssl);
          return iVar6;
        }
        free(ssl->handshake->cookie);
        ssl->handshake->cookie = (uchar *)0x0;
        ssl->handshake->cookie_len = '\0';
      }
      uVar10 = ssl->in_hslen;
      sVar9 = mbedtls_ssl_hs_hdr_len(ssl);
      if ((uVar10 < sVar9 + 0x26) || (*_handshake_failure != '\x02')) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                   ,0x4e0,"bad server hello message");
        mbedtls_ssl_send_alert_message(ssl,'\x02','2');
        ssl_local._4_4_ = -0x7300;
      }
      else {
        sVar9 = mbedtls_ssl_hs_hdr_len(ssl);
        _handshake_failure = _handshake_failure + sVar9;
        uVar15 = 0;
        mbedtls_debug_print_buf
                  (ssl,3,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                   ,0x4f3,"server hello, version",_handshake_failure,2);
        uVar5 = mbedtls_ssl_read_version(_handshake_failure,(uint)ssl->conf->transport);
        ssl->tls_version = (uint)uVar5;
        ssl->session_negotiate->tls_version = ssl->tls_version;
        if ((ssl->tls_version < ssl->conf->min_tls_version) ||
           (ssl->conf->max_tls_version < ssl->tls_version)) {
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                     ,0x4ff,
                     "server version out of bounds -  min: [0x%x], server: [0x%x], max: [0x%x]",
                     (ulong)ssl->conf->min_tls_version,CONCAT44(uVar15,ssl->tls_version),
                     ssl->conf->max_tls_version);
          mbedtls_ssl_send_alert_message(ssl,'\x02','F');
          ssl_local._4_4_ = -0x6e80;
        }
        else {
          mbedtls_debug_print_msg
                    (ssl,3,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                     ,0x50b,"server hello, current time: %lu",
                     (ulong)_handshake_failure[2] << 0x18 | (ulong)_handshake_failure[3] << 0x10 |
                     (ulong)_handshake_failure[4] << 8 | (ulong)_handshake_failure[5]);
          pmVar1 = ssl->handshake;
          *(undefined8 *)(pmVar1->randbytes + 0x20) = *(undefined8 *)(_handshake_failure + 2);
          *(undefined8 *)(pmVar1->randbytes + 0x28) = *(undefined8 *)(_handshake_failure + 10);
          *(undefined8 *)(pmVar1->randbytes + 0x30) = *(undefined8 *)(_handshake_failure + 0x12);
          *(undefined8 *)(pmVar1->randbytes + 0x38) = *(undefined8 *)(_handshake_failure + 0x1a);
          uVar10 = (ulong)_handshake_failure[0x22];
          mbedtls_debug_print_buf
                    (ssl,3,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                     ,0x511,"server hello, random bytes",_handshake_failure + 2,0x20);
          if (uVar10 < 0x21) {
            uVar2 = ssl->in_hslen;
            sVar9 = mbedtls_ssl_hs_hdr_len(ssl);
            if (sVar9 + 0x27 + uVar10 < uVar2) {
              buf = (uchar *)(long)(int)(uint)CONCAT11(_handshake_failure[uVar10 + 0x26],
                                                       _handshake_failure[uVar10 + 0x27]);
              if (((buf != (uchar *)0x0) && (buf < (uchar *)0x4)) ||
                 (puVar3 = (uchar *)ssl->in_hslen, sVar9 = mbedtls_ssl_hs_hdr_len(ssl),
                 puVar3 != buf + sVar9 + 0x28 + uVar10)) {
                mbedtls_debug_print_msg
                          (ssl,1,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                           ,0x520,"bad server hello message");
                mbedtls_ssl_send_alert_message(ssl,'\x02','2');
                return -0x7300;
              }
            }
            else {
              sVar9 = ssl->in_hslen;
              sVar11 = mbedtls_ssl_hs_hdr_len(ssl);
              if (sVar9 != sVar11 + 0x26 + uVar10) {
                mbedtls_debug_print_msg
                          (ssl,1,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                           ,0x52a,"bad server hello message");
                mbedtls_ssl_send_alert_message(ssl,'\x02','2');
                return -0x7300;
              }
              buf = (uchar *)0x0;
            }
            uVar7 = (uint)CONCAT11(_handshake_failure[uVar10 + 0x23],
                                   _handshake_failure[uVar10 + 0x24]);
            if (_handshake_failure[uVar10 + 0x25] == 0) {
              pmVar12 = mbedtls_ssl_ciphersuite_from_id(uVar7);
              ssl->handshake->ciphersuite_info = pmVar12;
              if (ssl->handshake->ciphersuite_info == (mbedtls_ssl_ciphersuite_t *)0x0) {
                mbedtls_debug_print_msg
                          (ssl,1,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                           ,0x548,"ciphersuite info for %04x not found",(ulong)uVar7);
                mbedtls_ssl_send_alert_message(ssl,'\x02','P');
                ssl_local._4_4_ = -0x7100;
              }
              else {
                mbedtls_ssl_optimize_checksum(ssl,ssl->handshake->ciphersuite_info);
                mbedtls_debug_print_msg
                          (ssl,3,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                           ,0x550,"server hello, session id len.: %zu",uVar10);
                mbedtls_debug_print_buf
                          (ssl,3,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                           ,0x551,"server hello, session id",_handshake_failure + 0x23,uVar10);
                if (((ssl->handshake->resume == '\0') || (uVar10 == 0)) ||
                   ((ssl->session_negotiate->ciphersuite != uVar7 ||
                    ((ssl->session_negotiate->id_len != uVar10 ||
                     (iVar6 = memcmp(ssl->session_negotiate->id,_handshake_failure + 0x23,uVar10),
                     iVar6 != 0)))))) {
                  ssl->state = ssl->state + 1;
                  ssl->handshake->resume = '\0';
                  ssl->session_negotiate->ciphersuite = uVar7;
                  ssl->session_negotiate->id_len = uVar10;
                  memcpy(ssl->session_negotiate->id,_handshake_failure + 0x23,uVar10);
                }
                else {
                  ssl->state = 0xc;
                }
                pcVar14 = "no";
                if (ssl->handshake->resume != '\0') {
                  pcVar14 = "a";
                }
                mbedtls_debug_print_msg
                          (ssl,3,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                           ,0x56a,"%s session has been resumed",pcVar14);
                mbedtls_debug_print_msg
                          (ssl,3,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                           ,0x56c,"server hello, chosen ciphersuite: %04x",(ulong)uVar7);
                mbedtls_debug_print_msg
                          (ssl,3,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                           ,0x56e,"server hello, compress alg.: %d",
                           (ulong)_handshake_failure[uVar10 + 0x25]);
                n._0_4_ = 0;
                do {
                  if (ssl->conf->ciphersuite_list[(int)n] == 0) {
                    mbedtls_debug_print_msg
                              (ssl,1,
                               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                               ,0x576,"bad server hello message");
                    mbedtls_ssl_send_alert_message(ssl,'\x02','/');
                    return -0x6600;
                  }
                  lVar13 = (long)(int)n;
                  n._0_4_ = (int)n + 1;
                } while (ssl->conf->ciphersuite_list[lVar13] != ssl->session_negotiate->ciphersuite)
                ;
                pmVar12 = mbedtls_ssl_ciphersuite_from_id(ssl->session_negotiate->ciphersuite);
                iVar6 = mbedtls_ssl_validate_ciphersuite
                                  (ssl,pmVar12,ssl->tls_version,ssl->tls_version);
                if (iVar6 == 0) {
                  mbedtls_debug_print_msg
                            (ssl,3,
                             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                             ,0x591,"server hello, chosen ciphersuite: %s",pmVar12->name);
                  _handshake_failure = _handshake_failure + uVar10 + 0x28;
                  mbedtls_debug_print_msg
                            (ssl,2,
                             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                             ,0x5a7,"server hello, total extension length: %zu",buf);
                  do {
                    if (buf == (uchar *)0x0) {
                      if ((ssl->handshake->resume != '\0') &&
                         (iVar6 = mbedtls_ssl_derive_keys(ssl), iVar6 != 0)) {
                        mbedtls_debug_print_ret
                                  (ssl,1,
                                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                                   ,0x64c,"mbedtls_ssl_derive_keys",iVar6);
                        mbedtls_ssl_send_alert_message(ssl,'\x02','P');
                        return iVar6;
                      }
                      if ((ssl->secure_renegotiation == 0) &&
                         (ssl->conf->allow_legacy_renegotiation == '\x02')) {
                        mbedtls_debug_print_msg
                                  (ssl,1,
                                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                                   ,0x65c,"legacy renegotiation, breaking off handshake");
                        bVar4 = true;
                      }
                      if (bVar4) {
                        mbedtls_ssl_send_alert_message(ssl,'\x02','(');
                        return -0x6e00;
                      }
                      mbedtls_debug_print_msg
                                (ssl,2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                                 ,0x67d,"<= parse server hello");
                      return 0;
                    }
                    uVar7 = (uint)CONCAT11(*_handshake_failure,_handshake_failure[1]);
                    uVar8 = (uint)CONCAT11(_handshake_failure[2],_handshake_failure[3]);
                    if (buf < (uchar *)(ulong)(uVar8 + 4)) {
                      mbedtls_debug_print_msg
                                (ssl,1,
                                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                                 ,0x5b0,"bad server hello message");
                      mbedtls_ssl_send_alert_message(ssl,'\x02','2');
                      return -0x7300;
                    }
                    if (uVar7 == 1) {
                      mbedtls_debug_print_msg
                                (ssl,3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                                 ,0x5c8,"found max_fragment_length extension");
                      iVar6 = ssl_parse_max_fragment_length_ext
                                        (ssl,_handshake_failure + 4,(ulong)uVar8);
joined_r0x00367f01:
                      if (iVar6 != 0) {
                        return iVar6;
                      }
                    }
                    else {
                      if (uVar7 == 0xb) {
                        mbedtls_debug_print_msg
                                  (ssl,3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                                   ,0x609,"found supported_point_formats extension");
                        iVar6 = ssl_parse_supported_point_formats_ext
                                          (ssl,_handshake_failure + 4,(ulong)uVar8);
                        goto joined_r0x00367f01;
                      }
                      if (uVar7 == 0x100) {
                        mbedtls_debug_print_msg
                                  (ssl,3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                                   ,0x617,"found ecjpake_kkpp extension");
                        iVar6 = ssl_parse_ecjpake_kkpp(ssl,_handshake_failure + 4,(ulong)uVar8);
                        goto joined_r0x00367f01;
                      }
                      if (uVar7 == 0xff01) {
                        mbedtls_debug_print_msg
                                  (ssl,3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                                   ,0x5b9,"found renegotiation extension");
                        iVar6 = ssl_parse_renegotiation_info
                                          (ssl,_handshake_failure + 4,(ulong)uVar8);
                        goto joined_r0x00367f01;
                      }
                      mbedtls_debug_print_msg
                                (ssl,3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                                 ,0x639,"unknown extension found: %u (ignoring)",(ulong)uVar7);
                    }
                    buf = buf + -(ulong)(uVar8 + 4);
                    _handshake_failure = _handshake_failure + (uVar8 + 4);
                  } while ((buf == (uchar *)0x0) || ((uchar *)0x3 < buf));
                  mbedtls_debug_print_msg
                            (ssl,1,
                             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                             ,0x640,"bad server hello message");
                  ssl_local._4_4_ = -0x7300;
                }
                else {
                  mbedtls_debug_print_msg
                            (ssl,1,
                             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                             ,0x588,"bad server hello message");
                  mbedtls_ssl_send_alert_message(ssl,'\x02','(');
                  ssl_local._4_4_ = -0x6e00;
                }
              }
            }
            else {
              mbedtls_debug_print_msg
                        (ssl,1,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                         ,0x53a,"server hello, bad compression: %d",
                         (ulong)_handshake_failure[uVar10 + 0x25]);
              mbedtls_ssl_send_alert_message(ssl,'\x02','/');
              ssl_local._4_4_ = -0x7080;
            }
          }
          else {
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                       ,0x514,"bad server hello message");
            mbedtls_ssl_send_alert_message(ssl,'\x02','2');
            ssl_local._4_4_ = -0x7300;
          }
        }
      }
    }
    else {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                 ,0x4c7,"bad server hello message");
      mbedtls_ssl_send_alert_message(ssl,'\x02','\n');
      ssl_local._4_4_ = -0x7700;
    }
  }
  else {
    mbedtls_debug_print_ret
              (ssl,1,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
               ,0x4ad,"mbedtls_ssl_read_record",ssl_local._4_4_);
  }
  return ssl_local._4_4_;
}

Assistant:

MBEDTLS_CHECK_RETURN_CRITICAL
static int ssl_parse_server_hello(mbedtls_ssl_context *ssl)
{
    int ret, i;
    size_t n;
    size_t ext_len;
    unsigned char *buf, *ext;
    unsigned char comp;
#if defined(MBEDTLS_SSL_RENEGOTIATION)
    int renegotiation_info_seen = 0;
#endif
    int handshake_failure = 0;
    const mbedtls_ssl_ciphersuite_t *suite_info;

    MBEDTLS_SSL_DEBUG_MSG(2, ("=> parse server hello"));

    if ((ret = mbedtls_ssl_read_record(ssl, 1)) != 0) {
        /* No alert on a read error. */
        MBEDTLS_SSL_DEBUG_RET(1, "mbedtls_ssl_read_record", ret);
        return ret;
    }

    buf = ssl->in_msg;

    if (ssl->in_msgtype != MBEDTLS_SSL_MSG_HANDSHAKE) {
#if defined(MBEDTLS_SSL_RENEGOTIATION)
        if (ssl->renego_status == MBEDTLS_SSL_RENEGOTIATION_IN_PROGRESS) {
            ssl->renego_records_seen++;

            if (ssl->conf->renego_max_records >= 0 &&
                ssl->renego_records_seen > ssl->conf->renego_max_records) {
                MBEDTLS_SSL_DEBUG_MSG(1,
                                      ("renegotiation requested, but not honored by server"));
                return MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE;
            }

            MBEDTLS_SSL_DEBUG_MSG(1,
                                  ("non-handshake message during renegotiation"));

            ssl->keep_current_message = 1;
            return MBEDTLS_ERR_SSL_WAITING_SERVER_HELLO_RENEGO;
        }
#endif /* MBEDTLS_SSL_RENEGOTIATION */

        MBEDTLS_SSL_DEBUG_MSG(1, ("bad server hello message"));
        mbedtls_ssl_send_alert_message(
            ssl,
            MBEDTLS_SSL_ALERT_LEVEL_FATAL,
            MBEDTLS_SSL_ALERT_MSG_UNEXPECTED_MESSAGE);
        return MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE;
    }

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if (ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM) {
        if (buf[0] == MBEDTLS_SSL_HS_HELLO_VERIFY_REQUEST) {
            MBEDTLS_SSL_DEBUG_MSG(2, ("received hello verify request"));
            MBEDTLS_SSL_DEBUG_MSG(2, ("<= parse server hello"));
            return ssl_parse_hello_verify_request(ssl);
        } else {
            /* We made it through the verification process */
            mbedtls_free(ssl->handshake->cookie);
            ssl->handshake->cookie = NULL;
            ssl->handshake->cookie_len = 0;
        }
    }
#endif /* MBEDTLS_SSL_PROTO_DTLS */

    if (ssl->in_hslen < 38 + mbedtls_ssl_hs_hdr_len(ssl) ||
        buf[0] != MBEDTLS_SSL_HS_SERVER_HELLO) {
        MBEDTLS_SSL_DEBUG_MSG(1, ("bad server hello message"));
        mbedtls_ssl_send_alert_message(ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                       MBEDTLS_SSL_ALERT_MSG_DECODE_ERROR);
        return MBEDTLS_ERR_SSL_DECODE_ERROR;
    }

    /*
     *  0   .  1    server_version
     *  2   . 33    random (maybe including 4 bytes of Unix time)
     * 34   . 34    session_id length = n
     * 35   . 34+n  session_id
     * 35+n . 36+n  cipher_suite
     * 37+n . 37+n  compression_method
     *
     * 38+n . 39+n  extensions length (optional)
     * 40+n .  ..   extensions
     */
    buf += mbedtls_ssl_hs_hdr_len(ssl);

    MBEDTLS_SSL_DEBUG_BUF(3, "server hello, version", buf, 2);
    ssl->tls_version = (mbedtls_ssl_protocol_version) mbedtls_ssl_read_version(buf,
                                                                               ssl->conf->transport);
    ssl->session_negotiate->tls_version = ssl->tls_version;

    if (ssl->tls_version < ssl->conf->min_tls_version ||
        ssl->tls_version > ssl->conf->max_tls_version) {
        MBEDTLS_SSL_DEBUG_MSG(1,
                              (
                                  "server version out of bounds -  min: [0x%x], server: [0x%x], max: [0x%x]",
                                  (unsigned) ssl->conf->min_tls_version,
                                  (unsigned) ssl->tls_version,
                                  (unsigned) ssl->conf->max_tls_version));

        mbedtls_ssl_send_alert_message(ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                       MBEDTLS_SSL_ALERT_MSG_PROTOCOL_VERSION);

        return MBEDTLS_ERR_SSL_BAD_PROTOCOL_VERSION;
    }

    MBEDTLS_SSL_DEBUG_MSG(3, ("server hello, current time: %lu",
                              ((unsigned long) buf[2] << 24) |
                              ((unsigned long) buf[3] << 16) |
                              ((unsigned long) buf[4] <<  8) |
                              ((unsigned long) buf[5])));

    memcpy(ssl->handshake->randbytes + 32, buf + 2, 32);

    n = buf[34];

    MBEDTLS_SSL_DEBUG_BUF(3,   "server hello, random bytes", buf + 2, 32);

    if (n > 32) {
        MBEDTLS_SSL_DEBUG_MSG(1, ("bad server hello message"));
        mbedtls_ssl_send_alert_message(ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                       MBEDTLS_SSL_ALERT_MSG_DECODE_ERROR);
        return MBEDTLS_ERR_SSL_DECODE_ERROR;
    }

    if (ssl->in_hslen > mbedtls_ssl_hs_hdr_len(ssl) + 39 + n) {
        ext_len = ((buf[38 + n] <<  8)
                   | (buf[39 + n]));

        if ((ext_len > 0 && ext_len < 4) ||
            ssl->in_hslen != mbedtls_ssl_hs_hdr_len(ssl) + 40 + n + ext_len) {
            MBEDTLS_SSL_DEBUG_MSG(1, ("bad server hello message"));
            mbedtls_ssl_send_alert_message(
                ssl,
                MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                MBEDTLS_SSL_ALERT_MSG_DECODE_ERROR);
            return MBEDTLS_ERR_SSL_DECODE_ERROR;
        }
    } else if (ssl->in_hslen == mbedtls_ssl_hs_hdr_len(ssl) + 38 + n) {
        ext_len = 0;
    } else {
        MBEDTLS_SSL_DEBUG_MSG(1, ("bad server hello message"));
        mbedtls_ssl_send_alert_message(ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                       MBEDTLS_SSL_ALERT_MSG_DECODE_ERROR);
        return MBEDTLS_ERR_SSL_DECODE_ERROR;
    }

    /* ciphersuite (used later) */
    i = (buf[35 + n] << 8) | buf[36 + n];

    /*
     * Read and check compression
     */
    comp = buf[37 + n];

    if (comp != MBEDTLS_SSL_COMPRESS_NULL) {
        MBEDTLS_SSL_DEBUG_MSG(1,
                              ("server hello, bad compression: %d", comp));
        mbedtls_ssl_send_alert_message(
            ssl,
            MBEDTLS_SSL_ALERT_LEVEL_FATAL,
            MBEDTLS_SSL_ALERT_MSG_ILLEGAL_PARAMETER);
        return MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE;
    }

    /*
     * Initialize update checksum functions
     */
    ssl->handshake->ciphersuite_info = mbedtls_ssl_ciphersuite_from_id(i);
    if (ssl->handshake->ciphersuite_info == NULL) {
        MBEDTLS_SSL_DEBUG_MSG(1,
                              ("ciphersuite info for %04x not found", (unsigned int) i));
        mbedtls_ssl_send_alert_message(ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                       MBEDTLS_SSL_ALERT_MSG_INTERNAL_ERROR);
        return MBEDTLS_ERR_SSL_BAD_INPUT_DATA;
    }

    mbedtls_ssl_optimize_checksum(ssl, ssl->handshake->ciphersuite_info);

    MBEDTLS_SSL_DEBUG_MSG(3, ("server hello, session id len.: %" MBEDTLS_PRINTF_SIZET, n));
    MBEDTLS_SSL_DEBUG_BUF(3,   "server hello, session id", buf + 35, n);

    /*
     * Check if the session can be resumed
     */
    if (ssl->handshake->resume == 0 || n == 0 ||
#if defined(MBEDTLS_SSL_RENEGOTIATION)
        ssl->renego_status != MBEDTLS_SSL_INITIAL_HANDSHAKE ||
#endif
        ssl->session_negotiate->ciphersuite != i ||
        ssl->session_negotiate->id_len != n ||
        memcmp(ssl->session_negotiate->id, buf + 35, n) != 0) {
        ssl->state++;
        ssl->handshake->resume = 0;
#if defined(MBEDTLS_HAVE_TIME)
        ssl->session_negotiate->start = mbedtls_time(NULL);
#endif
        ssl->session_negotiate->ciphersuite = i;
        ssl->session_negotiate->id_len = n;
        memcpy(ssl->session_negotiate->id, buf + 35, n);
    }